

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.h
# Opt level: O3

int __thiscall KMPNativeAffinity::Mask::set_system_affinity(Mask *this,bool abort_on_error)

{
  long lVar1;
  int *piVar2;
  int code;
  kmp_msg_t local_50;
  kmp_msg_t local_38;
  
  if (__kmp_affin_mask_size == 0) {
    __kmp_debug_assert("assertion failure",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jmellorcrummey[P]llvm-openmp-5/runtime/src/kmp_affinity.h"
                       ,0x136);
  }
  code = 0;
  lVar1 = syscall(0xcb,0,__kmp_affin_mask_size,this->mask);
  if ((int)lVar1 < 0) {
    piVar2 = __errno_location();
    code = *piVar2;
    if (abort_on_error) {
      __kmp_msg_format(&local_38,0x40064);
      __kmp_msg_error_code(&local_50,code);
      __kmp_fatal();
    }
  }
  return code;
}

Assistant:

int set_system_affinity(bool abort_on_error) const override {
      KMP_ASSERT2(KMP_AFFINITY_CAPABLE(),
                  "Illegal get affinity operation when not capable");
      int retval =
          syscall(__NR_sched_setaffinity, 0, __kmp_affin_mask_size, mask);
      if (retval >= 0) {
        return 0;
      }
      int error = errno;
      if (abort_on_error) {
        __kmp_fatal(KMP_MSG(FatalSysError), KMP_ERR(error), __kmp_msg_null);
      }
      return error;
    }